

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int regNewData,int *aRegIdx,
               int update_flags,int appendBias,int useSeekResult)

{
  Op *pOVar1;
  bool bVar2;
  int iVar3;
  Vdbe *p;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  Index *pIVar7;
  
  p = sqlite3GetVdbe(pParse);
  pIVar7 = pTab->pIndex;
  if (pIVar7 == (Index *)0x0) {
    bVar2 = true;
  }
  else {
    bVar4 = (useSeekResult != 0) << 4;
    bVar2 = false;
    do {
      if (*aRegIdx != 0) {
        if (pIVar7->pPartIdxWhere != (Expr *)0x0) {
          sqlite3VdbeAddOp3(p,0x32,*aRegIdx,p->nOp + 2,0);
        }
        uVar5 = (ushort)bVar4;
        if ((*(ushort *)&pIVar7->field_0x63 & 3) == 2) {
          uVar5 = (ushort)(byte)(((byte)update_flags & 2 | bVar4) + 1);
          if ((pTab->tabFlags & 0x20) == 0) {
            uVar5 = (ushort)bVar4;
          }
        }
        uVar6 = (&pIVar7->nKeyCol)[(*(ushort *)&pIVar7->field_0x63 & 8) == 0];
        iVar3 = sqlite3VdbeAddOp3(p,0x84,iIdxCur,*aRegIdx,*aRegIdx + 1);
        if (p->db->mallocFailed == '\0') {
          pOVar1 = p->aOp;
          pOVar1[iVar3].p4type = -3;
          *(uint *)&pOVar1[iVar3].p4 = (uint)uVar6;
        }
        bVar2 = true;
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = uVar5;
        }
      }
      pIVar7 = pIVar7->pNext;
      iIdxCur = iIdxCur + 1;
      aRegIdx = aRegIdx + 1;
    } while (pIVar7 != (Index *)0x0);
    bVar2 = !bVar2;
  }
  if ((pTab->tabFlags & 0x20) == 0) {
    if (pParse->nTempReg == '\0') {
      iVar3 = pParse->nMem + 1;
      pParse->nMem = iVar3;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar3 = pParse->aTempReg[bVar4];
    }
    sqlite3VdbeAddOp3(p,0x5c,regNewData + 1,(int)pTab->nCol,iVar3);
    if (bVar2) {
      sqlite3TableAffinity(p,pTab,0);
    }
    uVar5 = 0x21;
    if (update_flags != 0) {
      uVar5 = (ushort)(byte)((byte)update_flags | 1);
    }
    uVar6 = 0;
    if (pParse->nested == '\0') {
      uVar6 = uVar5;
    }
    uVar5 = (ushort)(byte)((byte)uVar6 | 8);
    if (appendBias == 0) {
      uVar5 = uVar6;
    }
    uVar6 = (ushort)(byte)((byte)uVar5 | 0x10);
    if (useSeekResult == 0) {
      uVar6 = uVar5;
    }
    sqlite3VdbeAddOp3(p,0x7a,iDataCur,iVar3,regNewData);
    if ((pParse->nested == '\0') && (p->db->mallocFailed == '\0')) {
      pOVar1 = p->aOp;
      iVar3 = p->nOp;
      pOVar1[(long)iVar3 + -1].p4type = -6;
      pOVar1[(long)iVar3 + -1].p4.pTab = pTab;
    }
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = uVar6;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int iDataCur,       /* Cursor of the canonical data source */
  int iIdxCur,        /* First index cursor */
  int regNewData,     /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int update_flags,   /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  Vdbe *v;            /* Prepared statements under construction */
  Index *pIdx;        /* An index being inserted or updated */
  u8 pik_flags;       /* flag values passed to the btree insert */
  int regData;        /* Content registers (after the rowid) */
  int regRec;         /* Register holding assembled record for the table */
  int i;              /* Loop counter */
  u8 bAffinityDone = 0; /* True if OP_Affinity has been run already */

  assert( update_flags==0
       || update_flags==OPFLAG_ISUPDATE
       || update_flags==(OPFLAG_ISUPDATE|OPFLAG_SAVEPOSITION)
  );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    if( aRegIdx[i]==0 ) continue;
    bAffinityDone = 1;
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_IsNull, aRegIdx[i], sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
    }
    pik_flags = (useSeekResult ? OPFLAG_USESEEKRESULT : 0);
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      assert( pParse->nested==0 );
      pik_flags |= OPFLAG_NCHANGE;
      pik_flags |= (update_flags & OPFLAG_SAVEPOSITION);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      if( update_flags==0 ){
        int r = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, r);
        sqlite3VdbeAddOp4(v, OP_Insert, 
            iIdxCur+i, aRegIdx[i], r, (char*)pTab, P4_TABLE
        );
        sqlite3VdbeChangeP5(v, OPFLAG_ISNOOP);
        sqlite3ReleaseTempReg(pParse, r);
      }
#endif
    }
    sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iIdxCur+i, aRegIdx[i],
                         aRegIdx[i]+1,
                         pIdx->uniqNotNull ? pIdx->nKeyCol: pIdx->nColumn);
    sqlite3VdbeChangeP5(v, pik_flags);
  }
  if( !HasRowid(pTab) ) return;
  regData = regNewData + 1;
  regRec = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regData, pTab->nCol, regRec);
  sqlite3SetMakeRecordP5(v, pTab);
  if( !bAffinityDone ){
    sqlite3TableAffinity(v, pTab, 0);
  }
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (update_flags?update_flags:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, iDataCur, regRec, regNewData);
  if( !pParse->nested ){
    sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}